

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle.cpp
# Opt level: O2

int beagleUpdatePrePartials
              (int instance,BeagleOperation *operations,int operationCount,
              int cumulativeScalingIndex)

{
  int iVar1;
  BeagleImpl *pBVar2;
  
  pBVar2 = beagle::getBeagleInstance(instance);
  if (pBVar2 != (BeagleImpl *)0x0) {
    iVar1 = (**(code **)(*(long *)pBVar2 + 0xe0))
                      (pBVar2,operations,operationCount,cumulativeScalingIndex,
                       *(code **)(*(long *)pBVar2 + 0xe0));
    return iVar1;
  }
  return -4;
}

Assistant:

int beagleUpdatePrePartials(const int instance,
                            const BeagleOperation* operations,
                            int operationCount,
                            int cumulativeScalingIndex){
    DEBUG_START_TIME();
    beagle::BeagleImpl* beagleInstance = beagle::getBeagleInstance(instance);
    if (beagleInstance == NULL)
        return BEAGLE_ERROR_UNINITIALIZED_INSTANCE;
    int returnValue = beagleInstance->updatePrePartials((const int *) operations, operationCount,
                                                        cumulativeScalingIndex);
    DEBUG_END_TIME();
    return returnValue;
}